

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMU_ATTEST_Unmarshal(TPMU_ATTEST *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_ATTEST *target_local;
  
  switch(selector) {
  case 0x8014:
    target_local._4_4_ = TPMS_NV_CERTIFY_INFO_Unmarshal(&target->nv,buffer,size);
    break;
  case 0x8015:
    target_local._4_4_ = TPMS_COMMAND_AUDIT_INFO_Unmarshal(&target->commandAudit,buffer,size);
    break;
  case 0x8016:
    target_local._4_4_ = TPMS_SESSION_AUDIT_INFO_Unmarshal(&target->sessionAudit,buffer,size);
    break;
  case 0x8017:
    target_local._4_4_ = TPMS_CERTIFY_INFO_Unmarshal(&target->certify,buffer,size);
    break;
  case 0x8018:
    target_local._4_4_ = TPMS_QUOTE_INFO_Unmarshal(&target->quote,buffer,size);
    break;
  case 0x8019:
    target_local._4_4_ = TPMS_TIME_ATTEST_INFO_Unmarshal(&target->time,buffer,size);
    break;
  case 0x801a:
    target_local._4_4_ = TPMS_CREATION_INFO_Unmarshal(&target->creation,buffer,size);
    break;
  default:
    target_local._4_4_ = 0x98;
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMU_ATTEST_Unmarshal(TPMU_ATTEST *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
        case TPM_ST_ATTEST_CERTIFY:
            return TPMS_CERTIFY_INFO_Unmarshal((TPMS_CERTIFY_INFO *)&(target->certify), buffer, size);
        case TPM_ST_ATTEST_CREATION:
            return TPMS_CREATION_INFO_Unmarshal((TPMS_CREATION_INFO *)&(target->creation), buffer, size);
        case TPM_ST_ATTEST_QUOTE:
            return TPMS_QUOTE_INFO_Unmarshal((TPMS_QUOTE_INFO *)&(target->quote), buffer, size);
        case TPM_ST_ATTEST_COMMAND_AUDIT:
            return TPMS_COMMAND_AUDIT_INFO_Unmarshal((TPMS_COMMAND_AUDIT_INFO *)&(target->commandAudit), buffer, size);
        case TPM_ST_ATTEST_SESSION_AUDIT:
            return TPMS_SESSION_AUDIT_INFO_Unmarshal((TPMS_SESSION_AUDIT_INFO *)&(target->sessionAudit), buffer, size);
        case TPM_ST_ATTEST_TIME:
            return TPMS_TIME_ATTEST_INFO_Unmarshal((TPMS_TIME_ATTEST_INFO *)&(target->time), buffer, size);
        case TPM_ST_ATTEST_NV:
            return TPMS_NV_CERTIFY_INFO_Unmarshal((TPMS_NV_CERTIFY_INFO *)&(target->nv), buffer, size);
    }
    return TPM_RC_SELECTOR;
}